

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCGSolver.cpp
# Opt level: O2

int __thiscall
amrex::MLCGSolver::solve_cg(MLCGSolver *this,MultiFab *sol,MultiFab *rhs,Real eps_rel,Real eps_abs)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  int *x;
  int ncomp;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Print *pPVar4;
  ostringstream *poVar5;
  MLCGSolver *pMVar6;
  Real RVar7;
  Real RVar8;
  Real RVar9;
  double dVar10;
  FabFactory<amrex::FArrayBox> *factory;
  ulong uVar11;
  undefined4 uVar12;
  Real local_968;
  undefined1 local_938 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_928 [15];
  MultiFab sorig;
  MultiFab q;
  MultiFab z;
  MultiFab r;
  MultiFab p;
  
  ncomp = (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  bxs = &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  factory = (sol->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  sorig.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       *(_func_int ***)(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
  sorig.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2];
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&p,bxs,dm,ncomp,(IntVect *)&sorig,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(&p.super_FabArray<amrex::FArrayBox>,0.0);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&sorig,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&r,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&z,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&q,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  MultiFab::Copy(&sorig,sol,0,0,ncomp,this->nghost);
  uVar11 = (ulong)factory & 0xffffffff00000000;
  (*this->Lp->_vptr_MLLinOp[0x11])
            (this->Lp,(ulong)(uint)this->amrlev,(ulong)(uint)this->mglev,&r,sol,rhs,uVar11,0);
  pMVar6 = (MLCGSolver *)sol;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&sol->super_FabArray<amrex::FArrayBox>,0.0);
  RVar7 = norm_inf(pMVar6,&r,false);
  if (0 < this->verbose) {
    poVar3 = OutStream();
    Print::Print((Print *)local_938,poVar3);
    std::operator<<((ostream *)avStack_928,"MLCGSolver_CG: Initial error (error0) :        ");
    std::ostream::_M_insert<double>(RVar7);
    std::operator<<((ostream *)avStack_928,'\n');
    Print::~Print((Print *)local_938);
  }
  this->iter = 1;
  if (((RVar7 == 0.0) && (!NAN(RVar7))) || (RVar7 < eps_abs)) {
    iVar2 = 0;
    if (0 < this->verbose) {
      poVar3 = OutStream();
      Print::Print((Print *)local_938,poVar3);
      std::operator<<((ostream *)avStack_928,"MLCGSolver_CG: niter = 0,");
      std::operator<<((ostream *)avStack_928,", rnorm = ");
      std::ostream::_M_insert<double>(RVar7);
      std::operator<<((ostream *)avStack_928,", eps_abs = ");
      std::ostream::_M_insert<double>(eps_abs);
      std::endl<char,std::char_traits<char>>((ostream *)avStack_928);
      Print::~Print((Print *)local_938);
    }
  }
  else {
    x = &this->iter;
    iVar2 = 1;
    dVar10 = 0.0;
    local_968 = RVar7;
    while (uVar12 = (undefined4)(uVar11 >> 0x20), bVar1 = true, iVar2 <= this->maxiter) {
      MultiFab::Copy(&z,&r,0,0,ncomp,this->nghost);
      RVar8 = dotxy(this,&z,&r,false);
      if ((RVar8 == 0.0) && (!NAN(RVar8))) {
LAB_004ff3db:
        bVar1 = false;
        break;
      }
      if (*x == 1) {
        MultiFab::Copy(&p,&z,0,0,ncomp,this->nghost);
      }
      else {
        anon_unknown_33::sxay(&p,&z,RVar8 / dVar10,&p,this->nghost);
      }
      uVar11 = CONCAT44(uVar12,1);
      (*this->Lp->_vptr_MLLinOp[0xd])
                (this->Lp,(ulong)(uint)this->amrlev,(ulong)(uint)this->mglev,&q,&p,0,uVar11,0);
      RVar9 = dotxy(this,&p,&q,false);
      if ((RVar9 == 0.0) && (!NAN(RVar9))) goto LAB_004ff3db;
      dVar10 = RVar8 / RVar9;
      if (2 < this->verbose) {
        poVar3 = OutStream();
        Print::Print((Print *)local_938,poVar3);
        std::operator<<((ostream *)avStack_928,"MLCGSolver_cg:");
        std::operator<<((ostream *)avStack_928," iter ");
        pPVar4 = Print::operator<<((Print *)local_938,x);
        poVar5 = &pPVar4->ss;
        std::operator<<((ostream *)poVar5," rho ");
        std::ostream::_M_insert<double>(RVar8);
        std::operator<<((ostream *)poVar5," alpha ");
        std::ostream::_M_insert<double>(dVar10);
        std::operator<<((ostream *)poVar5,'\n');
        Print::~Print((Print *)local_938);
      }
      anon_unknown_33::sxay(sol,sol,dVar10,&p,this->nghost);
      pMVar6 = (MLCGSolver *)&r;
      anon_unknown_33::sxay(&r,&r,-dVar10,&q,this->nghost);
      local_968 = norm_inf(pMVar6,&r,false);
      if (2 < this->verbose) {
        poVar3 = OutStream();
        Print::Print((Print *)local_938,poVar3);
        std::operator<<((ostream *)avStack_928,"MLCGSolver_cg:       Iteration");
        *(undefined8 *)
         ((long)&avStack_928[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage +
         avStack_928[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) = 4;
        pPVar4 = Print::operator<<((Print *)local_938,x);
        std::operator<<((ostream *)&pPVar4->ss," rel. err. ");
        std::ostream::_M_insert<double>(local_968 / RVar7);
        std::operator<<((ostream *)&pPVar4->ss,'\n');
        Print::~Print((Print *)local_938);
      }
      if ((local_968 < eps_rel * RVar7) || (local_968 < eps_abs)) break;
      iVar2 = *x + 1;
      *x = iVar2;
      dVar10 = RVar8;
    }
    if (0 < this->verbose) {
      poVar3 = OutStream();
      Print::Print((Print *)local_938,poVar3);
      std::operator<<((ostream *)avStack_928,"MLCGSolver_cg: Final Iteration");
      *(undefined8 *)
       ((long)&avStack_928[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage +
       avStack_928[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) = 4;
      pPVar4 = Print::operator<<((Print *)local_938,x);
      std::operator<<((ostream *)&pPVar4->ss," rel. err. ");
      std::ostream::_M_insert<double>(local_968 / RVar7);
      std::operator<<((ostream *)&pPVar4->ss,'\n');
      Print::~Print((Print *)local_938);
    }
    if (bVar1) {
      iVar2 = 0;
      if ((eps_rel * RVar7 < local_968) && (eps_abs < local_968)) {
        iVar2 = 8;
        if ((0 < this->verbose) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
          Warning_host("MLCGSolver_cg: failed to converge!");
        }
      }
      if (local_968 < RVar7) {
        MultiFab::plus(sol,&sorig,0,ncomp,this->nghost);
        goto LAB_004ff518;
      }
    }
    else {
      iVar2 = 1;
    }
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&sol->super_FabArray<amrex::FArrayBox>,0.0);
    MultiFab::plus(sol,&sorig,0,ncomp,this->nghost);
  }
LAB_004ff518:
  MultiFab::~MultiFab(&q);
  MultiFab::~MultiFab(&z);
  MultiFab::~MultiFab(&r);
  MultiFab::~MultiFab(&sorig);
  MultiFab::~MultiFab(&p);
  return iVar2;
}

Assistant:

int
MLCGSolver::solve_cg (MultiFab&       sol,
                      const MultiFab& rhs,
                      Real            eps_rel,
                      Real            eps_abs)
{
    BL_PROFILE("MLCGSolver::cg");

    const int ncomp = sol.nComp();

    const BoxArray& ba = sol.boxArray();
    const DistributionMapping& dm = sol.DistributionMap();
    const auto& factory = sol.Factory();

    MultiFab p(ba, dm, ncomp, sol.nGrowVect(), MFInfo(), factory);
    p.setVal(0.0);

    MultiFab sorig(ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab r    (ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab z    (ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab q    (ba, dm, ncomp, nghost, MFInfo(), factory);

    MultiFab::Copy(sorig,sol,0,0,ncomp,nghost);

    Lp.correctionResidual(amrlev, mglev, r, sol, rhs, MLLinOp::BCMode::Homogeneous);

    sol.setVal(0);

    Real       rnorm    = norm_inf(r);
    const Real rnorm0   = rnorm;

    if ( verbose > 0 )
    {
        amrex::Print() << "MLCGSolver_CG: Initial error (error0) :        " << rnorm0 << '\n';
    }

    Real rho_1 = 0;
    int  ret = 0;
    iter = 1;

    if ( rnorm0 == 0 || rnorm0 < eps_abs )
    {
        if ( verbose > 0 ) {
            amrex::Print() << "MLCGSolver_CG: niter = 0,"
                           << ", rnorm = " << rnorm
                           << ", eps_abs = " << eps_abs << std::endl;
        }
        return ret;
    }

    for (; iter <= maxiter; ++iter)
    {
        MultiFab::Copy(z,r,0,0,ncomp,nghost);

        Real rho = dotxy(z,r);

        if ( rho == 0 )
        {
            ret = 1; break;
        }
        if (iter == 1)
        {
            MultiFab::Copy(p,z,0,0,ncomp,nghost);
        }
        else
        {
            Real beta = rho/rho_1;
            sxay(p, z, beta, p, nghost);
        }
        Lp.apply(amrlev, mglev, q, p, MLLinOp::BCMode::Homogeneous, MLLinOp::StateMode::Correction);

        Real alpha;
        Real pw = dotxy(p,q);
        if ( pw != Real(0.0))
        {
            alpha = rho/pw;
        }
        else
        {
            ret = 1; break;
        }

        if ( verbose > 2 )
        {
            amrex::Print() << "MLCGSolver_cg:"
                           << " iter " << iter
                           << " rho " << rho
                           << " alpha " << alpha << '\n';
        }
        sxay(sol, sol, alpha, p, nghost);
        sxay(  r,   r,-alpha, q, nghost);
        rnorm = norm_inf(r);

        if ( verbose > 2 )
        {
            amrex::Print() << "MLCGSolver_cg:       Iteration"
                           << std::setw(4) << iter
                           << " rel. err. "
                           << rnorm/(rnorm0) << '\n';
        }

        if ( rnorm < eps_rel*rnorm0 || rnorm < eps_abs ) break;

        rho_1 = rho;
    }

    if ( verbose > 0 )
    {
        amrex::Print() << "MLCGSolver_cg: Final Iteration"
                       << std::setw(4) << iter
                       << " rel. err. "
                       << rnorm/(rnorm0) << '\n';
    }

    if ( ret == 0 &&  rnorm > eps_rel*rnorm0 && rnorm > eps_abs )
    {
        if ( verbose > 0 && ParallelDescriptor::IOProcessor() )
            amrex::Warning("MLCGSolver_cg: failed to converge!");
        ret = 8;
    }

    if ( ( ret == 0 || ret == 8 ) && (rnorm < rnorm0) )
    {
        sol.plus(sorig, 0, ncomp, nghost);
    }
    else
    {
        sol.setVal(0);
        sol.plus(sorig, 0, ncomp, nghost);
    }

    return ret;
}